

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::SqlGenerator(SqlGenerator *this,shared_ptr<Launcher> *launcher)

{
  CodeGenerator *in_RDI;
  Launcher *in_stack_ffffffffffffff68;
  Launcher *this_00;
  shared_ptr<Application> *this_01;
  
  CodeGenerator::CodeGenerator(in_RDI);
  in_RDI->_vptr_CodeGenerator = (_func_int **)&PTR__SqlGenerator_0037fc90;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::shared_ptr<TreeDecomposition>::shared_ptr((shared_ptr<TreeDecomposition> *)0x30ee61);
  std::shared_ptr<QueryCompiler>::shared_ptr((shared_ptr<QueryCompiler> *)0x30ee74);
  std::shared_ptr<Application>::shared_ptr((shared_ptr<Application> *)0x30ee87);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x30ee91);
  Launcher::getTreeDecomposition(in_stack_ffffffffffffff68);
  this_01 = (shared_ptr<Application> *)&stack0xffffffffffffffe0;
  std::shared_ptr<TreeDecomposition>::operator=
            ((shared_ptr<TreeDecomposition> *)this_01,
             (shared_ptr<TreeDecomposition> *)in_stack_ffffffffffffff68);
  std::shared_ptr<TreeDecomposition>::~shared_ptr((shared_ptr<TreeDecomposition> *)0x30eec2);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x30eecc);
  Launcher::getCompiler(in_stack_ffffffffffffff68);
  this_00 = (Launcher *)&stack0xffffffffffffffc0;
  std::shared_ptr<QueryCompiler>::operator=
            ((shared_ptr<QueryCompiler> *)this_01,(shared_ptr<QueryCompiler> *)this_00);
  std::shared_ptr<QueryCompiler>::~shared_ptr((shared_ptr<QueryCompiler> *)0x30eefb);
  std::__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Launcher,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x30ef05);
  Launcher::getApplication(this_00);
  std::shared_ptr<Application>::operator=(this_01,(shared_ptr<Application> *)this_00);
  std::shared_ptr<Application>::~shared_ptr((shared_ptr<Application> *)0x30ef31);
  return;
}

Assistant:

SqlGenerator::SqlGenerator(std::shared_ptr<Launcher> launcher) 
{
     DINFO("Constructing SQL - Generator \n");
   
    _td = launcher->getTreeDecomposition();
    _qc = launcher->getCompiler();
    _app = launcher->getApplication();    
}